

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::ExtPubkey::GetFingerprintData(ByteData *__return_storage_ptr__,ExtPubkey *this)

{
  value_type_conflict *__val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + 4);
  *(uint32_t *)
   local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  *(uint32_t *)
   local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = this->fingerprint_;
  local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::ByteData(__return_storage_ptr__,&local_38);
  if ((uint32_t *)
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ExtPubkey::GetFingerprintData() const {
  std::vector<uint8_t> byte_data(4);
  byte_data[3] = (fingerprint_ >> 24) & 0xff;
  byte_data[2] = (fingerprint_ >> 16) & 0xff;
  byte_data[1] = (fingerprint_ >> 8) & 0xff;
  byte_data[0] = fingerprint_ & 0xff;
  return ByteData(byte_data);
}